

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O3

void process_task(void *p)

{
  list_head *plVar1;
  long *plVar2;
  undefined8 *puVar3;
  int iVar4;
  uint uVar5;
  RK_U32 RVar6;
  pthread_mutex_t *__mutex;
  list_head *plVar7;
  list_head *plVar8;
  list_head *plVar9;
  list_head *plVar10;
  MppCbCtx *ctx;
  list_head *plVar11;
  long lVar12;
  long *plVar13;
  MppDevBatCmd *pMVar14;
  MppReqV1 *pMVar15;
  long lVar16;
  MppReqV1 *pMVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  MppDevBatTask *batch;
  uint uVar20;
  int iVar21;
  RK_S32 RVar22;
  list_head *head__;
  int *piVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  char *fmt;
  list_head *plVar27;
  long *plVar28;
  list_head *plVar29;
  list_head *head___1;
  list_head *head___2;
  char *in_stack_ffffffffffffff90;
  
  __mutex = *p;
  if (((byte)mpp_server_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_server","process task start\n",(char *)0x0);
  }
  plVar1 = (list_head *)((long)p + 0x38);
  plVar29 = *(list_head **)((long)p + 0x38);
  if (plVar29 != plVar1) {
    do {
      if ((*(int *)((long)&plVar29[4].next + 4) == 0) &&
         (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "batch->wait_req_cnt","process_task",0x103), (mpp_debug._3_1_ & 0x10) != 0))
      goto LAB_00173d45;
      uVar20 = mpp_service_ioctl_request(*(RK_S32 *)((long)p + 8),(MppReqV1 *)plVar29[3].prev);
      if (uVar20 != 0) {
        uVar5 = *(uint *)&plVar29[2].next;
        piVar23 = __errno_location();
        iVar4 = *piVar23;
        in_stack_ffffffffffffff90 = strerror(iVar4);
        _mpp_log_l(4,"mpp_server","batch %d poll ret %d errno %d %s","process_task",(ulong)uVar5,
                   (ulong)uVar20,iVar4,in_stack_ffffffffffffff90);
        _mpp_log_l(4,"mpp_server","stop timer\n","process_task");
        mpp_timer_set_enable(*(MppTimer *)((long)p + 0x18),0);
        break;
      }
      plVar7 = plVar29[1].next;
joined_r0x001734b9:
      plVar11 = plVar7;
      if (plVar11 != plVar29 + 1) {
        plVar7 = plVar11->next;
        plVar27 = plVar29[2].prev + *(int *)&plVar11[2].prev;
        if ((*(int *)&plVar11[2].prev < *(int *)((long)p + 0x70)) ||
           (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "batch_slot_id < server->max_task_in_batch","process_task",0x10c),
           (mpp_debug._3_1_ & 0x10) == 0)) {
          iVar4 = *(int *)((long)&plVar27->prev + 4);
          if (iVar4 != 0) goto code_r0x00173526;
          plVar8 = plVar11[1].next;
          plVar9 = plVar11->next;
          plVar10 = plVar11->prev;
          plVar9->prev = plVar10;
          plVar10->next = plVar9;
          plVar11->next = plVar11;
          plVar11->prev = plVar11;
          plVar11[1].prev = (list_head *)0x0;
          if (((byte)mpp_server_debug & 1) != 0) {
            _mpp_log_l(4,"mpp_server","batch %d:%d session %d ready and remove\n",(char *)0x0,
                       (ulong)*(uint *)&plVar29[2].next,(ulong)*(uint *)&plVar11[2].prev,
                       *(undefined4 *)&plVar8[4].prev);
          }
          pthread_mutex_lock((pthread_mutex_t *)plVar8->next);
          *(int *)&plVar8[5].next = *(int *)&plVar8[5].next + 1;
          pthread_cond_signal((pthread_cond_t *)&plVar8->next[2].prev);
          pthread_mutex_unlock((pthread_mutex_t *)plVar8->next);
          if ((plVar8[3].prev != (list_head *)0x0) &&
             (ctx = (MppCbCtx *)plVar8[3].prev[2].next, ctx != (MppCbCtx *)0x0)) {
            mpp_callback_f("process_task",ctx,(void *)0x0);
          }
          piVar23 = (int *)((long)&plVar29[5].next + 4);
          *piVar23 = *piVar23 + 1;
          goto LAB_0017360a;
        }
        goto LAB_00173d45;
      }
      if (((byte)mpp_server_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_server","batch %d fill %d poll %d\n",(char *)0x0,
                   (ulong)*(uint *)&plVar29[2].next,(ulong)*(uint *)&plVar29[4].prev,
                   *(undefined4 *)((long)&plVar29[5].next + 4));
      }
      if (*(int *)((long)&plVar29[5].next + 4) != *(int *)&plVar29[4].prev) break;
      if (((byte)mpp_server_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_server","batch %d poll done\n",(char *)0x0,
                   (ulong)*(uint *)&plVar29[2].next);
      }
      plVar7 = plVar29->next;
      plVar11 = plVar29->prev;
      plVar7->prev = plVar11;
      plVar11->next = plVar7;
      plVar29->prev = plVar29;
      plVar7 = *(list_head **)((long)p + 0x50);
      *(list_head **)((long)p + 0x50) = plVar29;
      plVar29->next = (list_head *)((long)p + 0x48);
      plVar29->prev = plVar7;
      plVar7->next = plVar29;
      *(ulong *)((long)p + 0x68) =
           CONCAT44((int)((ulong)*(undefined8 *)((long)p + 0x68) >> 0x20) + 1,
                    (int)*(undefined8 *)((long)p + 0x68) + -1);
      batch_reset((MppDevBatTask *)&plVar29[-1].prev);
      plVar29 = *(list_head **)((long)p + 0x38);
    } while (plVar29 != plVar1);
  }
  pthread_mutex_lock(__mutex);
  uVar20 = *(uint *)((long)p + 0x88);
  if ((((uVar20 == 0) && (*(int *)((long)p + 0x68) == 0)) && (*(int *)((long)p + 0x30) == 0)) &&
     (mpp_timer_set_enable(*(MppTimer *)((long)p + 0x18),0), ((byte)mpp_server_debug & 1) != 0)) {
    _mpp_log_l(4,"mpp_server","stop timer\n",(char *)0x0);
  }
  pthread_mutex_unlock(__mutex);
  if (((byte)mpp_server_debug & 1) != 0) {
    in_stack_ffffffffffffff90 =
         (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                          *(undefined4 *)((long)p + 0x60));
    _mpp_log_l(4,"mpp_server","pending %d running %d free %d max %d process start\n",(char *)0x0,
               (ulong)uVar20,(ulong)*(uint *)((long)p + 0x68),*(undefined4 *)((long)p + 0x6c),
               in_stack_ffffffffffffff90);
  }
  plVar2 = (long *)((long)p + 0x48);
  while( true ) {
    if (*(int *)((long)p + 0x6c) == 0) {
      if (*(int *)((long)p + 0x60) <= *(int *)((long)p + 0x68)) {
        if (((byte)mpp_server_debug & 1) == 0) {
          return;
        }
        fmt = "finish for not batch slot\n";
        goto LAB_00173d29;
      }
      batch_add((MppDevBatServ *)p);
      if ((*(int *)((long)p + 0x6c) == 0) &&
         (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "server->batch_free","process_task",0x159), (mpp_debug._3_1_ & 0x10) != 0))
      goto LAB_00173d45;
    }
    if (uVar20 == 0) break;
    if (((byte)mpp_server_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_server","pending task %d left to process\n",(char *)0x0,(ulong)uVar20);
    }
    if (*(int *)((long)p + 0x6c) == 0) {
      return;
    }
    batch = (MppDevBatTask *)((long *)*plVar2 + -1);
    if (((long *)*plVar2 == plVar2) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"batch",
                   "process_task",0x17a), batch = (MppDevBatTask *)0x0,
       (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_00173d45;
    pthread_mutex_lock(__mutex);
    plVar28 = (long *)0x0;
    if (*(long **)((long)p + 0x78) != (long *)((long)p + 0x78)) {
      plVar28 = *(long **)((long)p + 0x78);
    }
    lVar12 = *plVar28;
    plVar13 = (long *)plVar28[1];
    *(long **)(lVar12 + 8) = plVar13;
    *plVar13 = lVar12;
    *plVar28 = (long)plVar28;
    plVar28[1] = (long)plVar28;
    *(int *)((long)p + 0x88) = *(int *)((long)p + 0x88) + -1;
    pthread_mutex_unlock(__mutex);
    iVar4 = batch->fill_cnt;
    if (iVar4 == 0) {
      RVar6 = *(RK_U32 *)((long)p + 0xc);
      *(RK_U32 *)((long)p + 0xc) = RVar6 + 1;
      batch->batch_id = RVar6;
    }
    plVar28[7] = (long)batch;
    iVar21 = iVar4 + 1;
    batch->fill_cnt = iVar21;
    *(int *)(plVar28 + 9) = iVar4;
    iVar25 = *(int *)((long)p + 0x70);
    if (iVar25 <= iVar4) {
      _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "task->batch_slot_id < server->max_task_in_batch","process_task",0x18b);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00173d45;
      iVar21 = batch->fill_cnt;
      iVar25 = *(int *)((long)p + 0x70);
    }
    plVar29 = (batch->link_tasks).prev;
    (batch->link_tasks).prev = (list_head *)(plVar28 + 4);
    plVar28[4] = (long)&batch->link_tasks;
    plVar28[5] = (long)plVar29;
    plVar29->next = (list_head *)(plVar28 + 4);
    if (iVar25 <= iVar21) {
      batch->fill_full = 1;
    }
    lVar12 = plVar28[6];
    if (((lVar12 == 0) &&
        (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"session",
                    "process_task",0x191), (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((*(long *)(lVar12 + 0x38) == 0 &&
        (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"session->ctx",
                    "process_task",0x192), (mpp_debug._3_1_ & 0x10) != 0)))) goto LAB_00173d45;
    pMVar14 = batch->bat_cmd;
    iVar4 = (int)plVar28[9];
    pMVar14[iVar4].flag = 0;
    pMVar14[iVar4].client = *(RK_S32 *)(lVar12 + 0x48);
    pMVar14[iVar4].ret = 0;
    pMVar15 = batch->send_reqs;
    iVar21 = batch->send_req_cnt;
    RVar22 = iVar21 + 1;
    batch->send_req_cnt = RVar22;
    pMVar17 = pMVar15 + iVar21;
    pMVar17->cmd = 0x204;
    pMVar17->flag = 1;
    pMVar17->size = 0x10;
    pMVar17->offset = 0;
    pMVar15[iVar21].data_ptr = (RK_U64)(pMVar14 + iVar4);
    if (0 < (int)plVar28[0xb]) {
      lVar24 = 0;
      lVar26 = 0;
      do {
        lVar16 = plVar28[10];
        pMVar17 = batch->send_reqs;
        iVar21 = batch->send_req_cnt;
        batch->send_req_cnt = iVar21 + 1;
        pMVar17[iVar21].data_ptr = *(RK_U64 *)(lVar16 + 0x10 + lVar24);
        puVar3 = (undefined8 *)(lVar16 + lVar24);
        uVar18 = *puVar3;
        uVar19 = puVar3[1];
        pMVar17 = pMVar17 + iVar21;
        pMVar17->cmd = (int)uVar18;
        pMVar17->flag = (int)((ulong)uVar18 >> 0x20);
        pMVar17->size = (int)uVar19;
        pMVar17->offset = (int)((ulong)uVar19 >> 0x20);
        lVar26 = lVar26 + 1;
        lVar24 = lVar24 + 0x18;
      } while (lVar26 < (int)plVar28[0xb]);
      RVar22 = batch->send_req_cnt;
    }
    if ((*(int *)((long)p + 0x70) * 0x10 < RVar22) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "batch->send_req_cnt <= server->max_task_in_batch * 16","process_task",0x1a9),
       (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_00173d45;
    pMVar15 = batch->wait_reqs;
    iVar21 = batch->wait_req_cnt;
    pMVar17 = pMVar15 + iVar21;
    pMVar17->cmd = 0x204;
    pMVar17->flag = 1;
    pMVar17->size = 0x10;
    pMVar17->offset = 0;
    pMVar15[iVar21].data_ptr = (RK_U64)(pMVar14 + iVar4);
    batch->wait_req_cnt = iVar21 + 2;
    pMVar15[(long)iVar21 + 1].cmd = 0x300;
    pMVar15[(long)iVar21 + 1].flag = 0x23;
    pMVar15 = pMVar15 + (long)iVar21 + 1;
    pMVar15->size = 0;
    pMVar15->offset = 0;
    pMVar15->data_ptr = 0;
    if (((byte)mpp_server_debug & 1) != 0) {
      in_stack_ffffffffffffff90 =
           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)plVar28[8]);
      _mpp_log_l(4,"mpp_server","batch %d:%d add task %d:%d:%d\n",(char *)0x0,(ulong)batch->batch_id
                 ,(ulong)*(uint *)(plVar28 + 9),*(undefined4 *)(lVar12 + 0x48),
                 in_stack_ffffffffffffff90,*(undefined4 *)((long)plVar28 + 0x44));
    }
    uVar20 = uVar20 - 1;
    if (batch->fill_full != 0) {
      plVar29 = &batch->link_server;
      plVar7 = (batch->link_server).next;
      plVar11 = (batch->link_server).prev;
      plVar7->prev = plVar11;
      plVar11->next = plVar7;
      (batch->link_server).prev = plVar29;
      plVar7 = *(list_head **)((long)p + 0x40);
      *(list_head **)((long)p + 0x40) = plVar29;
      (batch->link_server).next = plVar1;
      (batch->link_server).prev = plVar7;
      plVar7->next = plVar29;
      if (((byte)mpp_server_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_server","batch %d -> fill_nb %d fill ready\n",(char *)0x0,
                   (ulong)batch->batch_id,(ulong)(uint)batch->fill_cnt);
      }
      batch_send((MppDevBatServ *)p,batch);
    }
  }
  if (*(int *)((long)p + 0x6c) != 0) {
    plVar28 = (long *)*plVar2;
    if (plVar28 == plVar2) {
      _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"batch","process_task",
                 0x163);
      if ((mpp_debug._3_1_ & 0x10) == 0) {
        _mpp_log_l(4,"mpp_server","batch run %d free %d\n","process_task",
                   (ulong)*(uint *)((long)p + 0x68),(ulong)*(uint *)((long)p + 0x6c));
        return;
      }
LAB_00173d45:
      abort();
    }
    if ((int)plVar28[9] != 0) {
      batch_send((MppDevBatServ *)p,(MppDevBatTask *)(plVar28 + -1));
    }
    if (((byte)mpp_server_debug & 1) != 0) {
      fmt = "finish for no pending task\n";
LAB_00173d29:
      _mpp_log_l(4,"mpp_server",fmt,(char *)0x0);
      return;
    }
  }
  return;
code_r0x00173526:
  if (iVar4 == -5) {
    _mpp_log_l(2,"mpp_server","batch %d:%d task %d poll error found\n","process_task",
               (ulong)*(uint *)&plVar29[2].next,(ulong)*(uint *)&plVar11[2].prev,
               *(undefined4 *)((long)&plVar11[2].next + 4));
LAB_0017360a:
    *(byte *)&plVar27->next = *(byte *)&plVar27->next | 1;
  }
  goto joined_r0x001734b9;
}

Assistant:

void process_task(void *p)
{
    MppDevBatServ *server = (MppDevBatServ *)p;
    Mutex *lock = server->lock;
    RK_S32 ret = MPP_OK;
    MppDevTask *task;
    MppDevBatTask *batch;
    MppDevSession *session = NULL;
    MppDevBatCmd *bat_cmd;
    MppReqV1 *req = NULL;
    RK_S32 pending = 0;

    mpp_serv_dbg_flow("process task start\n");

    /* 1. try poll and get finished task */
    do {
        batch = list_first_entry_or_null(&server->list_batch, MppDevBatTask, link_server);
        if (NULL == batch)
            break;

        mpp_assert(batch->wait_req_cnt);
        ret = mpp_service_ioctl_request(server->server_fd, batch->wait_reqs);
        if (!ret) {
            MppDevTask *n;

            list_for_each_entry_safe(task, n, &batch->link_tasks, MppDevTask, link_batch) {
                RK_S32 batch_slot_id = task->batch_slot_id;
                MppDevBatCmd *cmd = batch->bat_cmd + batch_slot_id;

                mpp_assert(batch_slot_id < server->max_task_in_batch);
                session = task->session;

                ret = cmd->ret;
                if (ret == EAGAIN)
                    continue;

                if (ret == -EIO) {
                    mpp_err_f("batch %d:%d task %d poll error found\n",
                              batch->batch_id, task->batch_slot_id, task->task_id);
                    cmd->flag |= 1;
                    continue;
                }
                if (ret == 0) {
                    list_del_init(&task->link_batch);
                    task->batch = NULL;

                    mpp_serv_dbg_flow("batch %d:%d session %d ready and remove\n",
                                      batch->batch_id, task->batch_slot_id, session->client);
                    session->cond->lock();
                    session->task_done++;
                    session->cond->signal();
                    session->cond->unlock();
                    if (session->ctx && session->ctx->dev_cb)
                        mpp_callback(session->ctx->dev_cb, NULL);

                    batch->poll_cnt++;
                    cmd->flag |= 1;
                }
            }

            mpp_serv_dbg_flow("batch %d fill %d poll %d\n", batch->batch_id,
                              batch->fill_cnt, batch->poll_cnt);

            if (batch->poll_cnt == batch->fill_cnt) {
                mpp_serv_dbg_flow("batch %d poll done\n", batch->batch_id);
                list_del_init(&batch->link_server);
                list_add_tail(&batch->link_server, &server->list_batch_free);
                server->batch_run--;
                server->batch_free++;

                batch_reset(batch);
                batch = NULL;
                continue;
            }
        } else {
            mpp_log_f("batch %d poll ret %d errno %d %s", batch->batch_id,
                      ret, errno, strerror(errno));
            mpp_log_f("stop timer\n");
            mpp_timer_set_enable(server->timer, 0);
        }
        break;
    } while (1);

    /* 2. get prending task to fill */
    lock->lock();
    pending = server->pending_count;
    if (!pending && !server->batch_run && !server->session_count) {
        mpp_timer_set_enable(server->timer, 0);
        mpp_serv_dbg_flow("stop timer\n");
    }
    lock->unlock();

    mpp_serv_dbg_flow("pending %d running %d free %d max %d process start\n",
                      pending, server->batch_run, server->batch_free, server->batch_max_count);

try_proc_pending_task:
    /* 3. try get batch task*/
    if (!server->batch_free) {
        /* if not enough and max count does not reached create new batch */
        if (server->batch_free + server->batch_run >= server->batch_max_count) {
            mpp_serv_dbg_flow("finish for not batch slot\n");
            return ;
        }

        batch_add(server);
    }
    mpp_assert(server->batch_free);

    /* 4. if no pending task to send check timeout batch and send it */
    if (!pending) {
        if (!server->batch_free) {
            /* no pending and no free batch just done */
            return;
        }

        batch = list_first_entry_or_null(&server->list_batch_free, MppDevBatTask, link_server);
        mpp_assert(batch);
        if (NULL == batch) {
            mpp_log_f("batch run %d free %d\n", server->batch_run, server->batch_free);
            return;
        }

        /* send one timeout task */
        if (batch->fill_cnt)
            batch_send(server, batch);

        mpp_serv_dbg_flow("finish for no pending task\n");
        return;
    }

    mpp_serv_dbg_flow("pending task %d left to process\n", pending);

    /* 5. add task to add batch and try send batch */
    if (!server->batch_free) {
        /* no pending and no free batch just done */
        return;
    }

    batch = list_first_entry_or_null(&server->list_batch_free, MppDevBatTask, link_server);
    mpp_assert(batch);
    mpp_assert(pending);

    task = NULL;
    lock->lock();
    task = list_first_entry_or_null(&server->pending_task, MppDevTask, link_server);
    list_del_init(&task->link_server);
    server->pending_count--;
    lock->unlock();
    pending--;

    /* first task and setup new batch id */
    if (!batch->fill_cnt)
        batch->batch_id = server->batch_id++;

    task->batch = batch;
    task->batch_slot_id = batch->fill_cnt++;
    mpp_assert(task->batch_slot_id < server->max_task_in_batch);
    list_add_tail(&task->link_batch, &batch->link_tasks);
    if (batch->fill_cnt >= server->max_task_in_batch)
        batch->fill_full = 1;

    session = task->session;
    mpp_assert(session);
    mpp_assert(session->ctx);

    bat_cmd = batch->bat_cmd + task->batch_slot_id;
    bat_cmd->flag = 0;
    bat_cmd->client = session->client;
    bat_cmd->ret = 0;

    /* fill task to batch */
    /* add session info before each session task and then copy session request */
    req = &batch->send_reqs[batch->send_req_cnt++];
    req->cmd = MPP_CMD_SET_SESSION_FD;
    req->flag = MPP_FLAGS_MULTI_MSG;
    req->offset = 0;
    req->size = sizeof(*bat_cmd);
    req->data_ptr = REQ_DATA_PTR(bat_cmd);

    {
        RK_S32 i;

        for (i = 0; i < task->req_cnt; i++)
            batch->send_reqs[batch->send_req_cnt++] = task->req[i];
    }

    mpp_assert(batch->send_req_cnt <= server->max_task_in_batch * MAX_REQ_NUM);

    /* setup poll request */
    req = &batch->wait_reqs[batch->wait_req_cnt++];
    req->cmd = MPP_CMD_SET_SESSION_FD;
    req->flag = MPP_FLAGS_MULTI_MSG;
    req->offset = 0;
    req->size = sizeof(*bat_cmd);
    req->data_ptr = REQ_DATA_PTR(bat_cmd);

    req = &batch->wait_reqs[batch->wait_req_cnt++];
    req->cmd = MPP_CMD_POLL_HW_FINISH;
    req->flag = MPP_FLAGS_POLL_NON_BLOCK | MPP_FLAGS_MULTI_MSG | MPP_FLAGS_LAST_MSG;
    req->offset = 0;
    req->size = 0;
    req->data_ptr = 0;

    mpp_serv_dbg_flow("batch %d:%d add task %d:%d:%d\n",
                      batch->batch_id, task->batch_slot_id, session->client,
                      task->slot_idx, task->task_id);

    if (batch->fill_full) {
        list_del_init(&batch->link_server);
        list_add_tail(&batch->link_server, &server->list_batch);
        mpp_serv_dbg_flow("batch %d -> fill_nb %d fill ready\n",
                          batch->batch_id, batch->fill_cnt);
        batch_send(server, batch);
        batch = NULL;
    }
    goto try_proc_pending_task;
}